

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void unruh_G(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx,_Bool include_is)

{
  undefined7 in_register_00000009;
  uint uVar1;
  ulong digest_size;
  uint8_t tmp [64];
  hash_context ctx;
  
  digest_size = (ulong)pp->digest_size;
  hash_init_prefix(&ctx,digest_size,'\x05');
  hash_update(&ctx,prf_round->seeds[vidx],(ulong)pp->seed_size);
  hash_final(&ctx);
  hash_squeeze(&ctx,tmp,digest_size);
  hash_init(&ctx,digest_size);
  hash_update(&ctx,tmp,digest_size);
  if ((int)CONCAT71(in_register_00000009,include_is) != 0) {
    hash_update(&ctx,prf_round->input_shares[vidx],(ulong)pp->input_output_size);
  }
  hash_update(&ctx,prf_round->communicated_bits[vidx],(ulong)pp->view_size);
  uVar1 = 0;
  if (include_is) {
    uVar1 = (uint)pp->input_output_size;
  }
  uVar1 = (uint)pp->view_size + (uint)pp->input_output_size + uVar1;
  hash_update_uint16_le(&ctx,(uint16_t)uVar1);
  hash_final(&ctx);
  hash_squeeze(&ctx,prf_round->gs[vidx],(ulong)uVar1);
  return;
}

Assistant:

static void unruh_G(const picnic_instance_t* pp, proof_round_t* prf_round, unsigned int vidx,
                    bool include_is) {
  const unsigned int digest_size = pp->digest_size;

  // Hash the seed with H_5, store digest in output
  hash_context ctx;
  hash_init_prefix(&ctx, digest_size, HASH_PREFIX_5);
  hash_update(&ctx, prf_round->seeds[vidx], pp->seed_size);
  hash_final(&ctx);

  uint8_t tmp[MAX_DIGEST_SIZE];
  hash_squeeze(&ctx, tmp, digest_size);
  hash_clear(&ctx);

  // Hash H_5(seed), the view, and the length
  hash_init(&ctx, digest_size);
  hash_update(&ctx, tmp, digest_size);
  if (include_is) {
    hash_update(&ctx, prf_round->input_shares[vidx], pp->input_output_size);
  }
  hash_update(&ctx, prf_round->communicated_bits[vidx], pp->view_size);
  const unsigned int outputlen =
      pp->view_size + pp->input_output_size + (include_is ? pp->input_output_size : 0);
  hash_update_uint16_le(&ctx, outputlen);
  hash_final(&ctx);
  hash_squeeze(&ctx, prf_round->gs[vidx], outputlen);
  hash_clear(&ctx);
}